

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testAlphabetAssertion(char *msg,int condition,char *format,int a)

{
  int a_local;
  char *format_local;
  int condition_local;
  char *msg_local;
  
  if (condition == 0) {
    foundError();
    printf("*** ERROR *** %s, ",msg);
    printf(format,(ulong)(uint)a);
    printf("\n");
  }
  return 1;
}

Assistant:

static int testAlphabetAssertion(char *msg, int condition, char *format, int a) {
    if (condition == 0) {
        foundError();
        printf("*** ERROR *** %s, ", msg);
        printf(format, a);
        printf("\n");
    }
    return 1;
}